

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void futime_cb(uv_fs_t *req)

{
  utime_check_t *c;
  uv_fs_t *req_local;
  
  if (req != &futime_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x34d,"req == &futime_req");
    abort();
  }
  if (futime_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x34e,"req->result == 0");
    abort();
  }
  if (futime_req.fs_type != UV_FS_FUTIME) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x34f,"req->fs_type == UV_FS_FUTIME");
    abort();
  }
  check_utime(*futime_req.data,*(double *)((long)futime_req.data + 8),
              *(double *)((long)futime_req.data + 0x10));
  uv_fs_req_cleanup(&futime_req);
  futime_cb_count = futime_cb_count + 1;
  return;
}

Assistant:

static void futime_cb(uv_fs_t* req) {
  utime_check_t* c;

  ASSERT(req == &futime_req);
  ASSERT(req->result == 0);
  ASSERT(req->fs_type == UV_FS_FUTIME);

  c = req->data;
  check_utime(c->path, c->atime, c->mtime);

  uv_fs_req_cleanup(req);
  futime_cb_count++;
}